

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O1

bool __thiscall
WorldShuffler::generate_region_requirement_hint(WorldShuffler *this,HintSource *hint_source)

{
  WorldRegion **__src;
  pointer *pppWVar1;
  pointer ppWVar2;
  WorldNode *start_node;
  WorldNode *end_node;
  WorldRegion **ppWVar3;
  RandomizerWorld *pRVar4;
  bool bVar5;
  mapped_type *ppWVar6;
  __normal_iterator<WorldRegion_**,_std::vector<WorldRegion_*,_std::allocator<WorldRegion_*>_>_>
  __dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer ppWVar9;
  WorldRegion *region;
  WorldSolver solver;
  WorldRegion *local_1a8;
  WorldRegion *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  pointer local_170;
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined8 uStack_150;
  
  ppWVar2 = (this->_hintable_region_requirements).
            super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_170 = (this->_hintable_region_requirements).
              super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (ppWVar2 == local_170) {
    local_1a8 = (WorldRegion *)0x0;
  }
  else {
    local_1a8 = (WorldRegion *)0x0;
    do {
      ppWVar9 = ppWVar2 + 1;
      local_198 = *ppWVar2;
      WorldSolver::WorldSolver((WorldSolver *)local_168,this->_world);
      WorldSolver::forbid_taking_items_from_nodes((WorldSolver *)local_168,&local_198->_nodes);
      ppWVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
                ::at(&this->_world->_nodes,&this->_world->_spawn_location->_node_id);
      start_node = *ppWVar6;
      end_node = hint_source->_node;
      World::starting_inventory
                ((vector<Item_*,_std::allocator<Item_*>_> *)&local_190,&this->_world->super_World);
      bVar5 = WorldSolver::try_to_solve
                        ((WorldSolver *)local_168,start_node,end_node,
                         (vector<Item_*,_std::allocator<Item_*>_> *)&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_190._M_dataplus._M_p,
                        local_190.field_2._M_allocated_capacity - (long)local_190._M_dataplus._M_p);
      }
      if (bVar5) {
        local_1a8 = local_198;
        __dest = std::
                 __find_if<__gnu_cxx::__normal_iterator<WorldRegion**,std::vector<WorldRegion*,std::allocator<WorldRegion*>>>,__gnu_cxx::__ops::_Iter_equals_val<WorldRegion*const>>
                           ((this->_hintable_region_requirements).
                            super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (this->_hintable_region_requirements).
                            super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish,&local_198);
        ppWVar3 = (this->_hintable_region_requirements).
                  super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (__dest._M_current != ppWVar3) {
          __src = __dest._M_current + 1;
          if (__src != ppWVar3) {
            memmove(__dest._M_current,__src,(long)ppWVar3 - (long)__src);
          }
          pppWVar1 = &(this->_hintable_region_requirements).
                      super__Vector_base<WorldRegion_*,_std::allocator<WorldRegion_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppWVar1 = *pppWVar1 + -1;
        }
      }
      WorldSolver::~WorldSolver((WorldSolver *)local_168);
      ppWVar2 = ppWVar9;
    } while (!bVar5 && ppWVar9 != local_170);
  }
  if (local_1a8 != (WorldRegion *)0x0) {
    bVar5 = is_region_avoidable(this,local_1a8);
    if (bVar5) {
      std::operator+(&local_190,"What you are looking for is not ",&local_1a8->_hint_name);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_190,".");
      local_168._0_8_ = &stack0xfffffffffffffea8;
      pRVar4 = (RandomizerWorld *)(pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if (pRVar4 == (RandomizerWorld *)paVar8) {
        local_158 = paVar8->_M_allocated_capacity;
        uStack_150 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_158 = paVar8->_M_allocated_capacity;
        local_168._0_8_ = pRVar4;
      }
      local_168._8_8_ = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&hint_source->_text,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
    }
    else {
      std::operator+(&local_190,"You might have a pleasant surprise wandering ",
                     &local_1a8->_hint_name);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_190,".");
      local_168._0_8_ = &stack0xfffffffffffffea8;
      pRVar4 = (RandomizerWorld *)(pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if (pRVar4 == (RandomizerWorld *)paVar8) {
        local_158 = paVar8->_M_allocated_capacity;
        uStack_150 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      }
      else {
        local_158 = paVar8->_M_allocated_capacity;
        local_168._0_8_ = pRVar4;
      }
      local_168._8_8_ = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&hint_source->_text,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
    }
    if ((RandomizerWorld *)local_168._0_8_ != (RandomizerWorld *)&stack0xfffffffffffffea8) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_158 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
  }
  return local_1a8 != (WorldRegion *)0x0;
}

Assistant:

bool WorldShuffler::generate_region_requirement_hint(HintSource* hint_source)
{
    WorldRegion* hinted_region = nullptr;
    for(WorldRegion* region : _hintable_region_requirements)
    {
        // Check that taking items from region is not mandatory to reach the hint source
        WorldSolver solver(_world);
        solver.forbid_taking_items_from_nodes(region->nodes());
        if(!solver.try_to_solve(_world.spawn_node(), hint_source->node(), _world.starting_inventory()))
            continue;

        hinted_region = region;
        vectools::erase_first(_hintable_region_requirements, region);
        break;
    }

    if(!hinted_region)
        return false;

    if (this->is_region_avoidable(hinted_region))
        hint_source->text("What you are looking for is not " + hinted_region->hint_name() + ".");
    else
        hint_source->text("You might have a pleasant surprise wandering " + hinted_region->hint_name() + ".");

    return true;
}